

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Input::setCurrentDocument(Input *this)

{
  document_iterator *this_00;
  HNode *pHVar1;
  bool bVar2;
  Node *Val;
  error_category *peVar3;
  document_iterator local_28;
  
  this_00 = &this->DocIterator;
  local_28 = yaml::Stream::end((this->Strm)._M_t.
                               super___uniq_ptr_impl<llvm::yaml::Stream,_std::default_delete<llvm::yaml::Stream>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_llvm::yaml::Stream_*,_std::default_delete<llvm::yaml::Stream>_>
                               .super__Head_base<0UL,_llvm::yaml::Stream_*,_false>._M_head_impl);
  bVar2 = document_iterator::operator!=(this_00,&stack0xffffffffffffffd8);
  if (bVar2) {
    Val = Document::getRoot((this_00->Doc->_M_t).
                            super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                            .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl);
    if (Val != (Node *)0x0) {
      bVar2 = isa_impl_cl<llvm::yaml::NullNode,_const_llvm::yaml::Node_*>::doit(Val);
      if (bVar2) {
        document_iterator::operator++(this_00);
        bVar2 = setCurrentDocument(this);
        return bVar2;
      }
      createHNodes((Input *)&stack0xffffffffffffffd8,(Node *)this);
      pHVar1 = (this->TopNode)._M_t.
               super___uniq_ptr_impl<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>
               ._M_t.
               super__Tuple_impl<0UL,_llvm::yaml::Input::HNode_*,_std::default_delete<llvm::yaml::Input::HNode>_>
               .super__Head_base<0UL,_llvm::yaml::Input::HNode_*,_false>._M_head_impl;
      (this->TopNode)._M_t.
      super___uniq_ptr_impl<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>
      ._M_t.
      super__Tuple_impl<0UL,_llvm::yaml::Input::HNode_*,_std::default_delete<llvm::yaml::Input::HNode>_>
      .super__Head_base<0UL,_llvm::yaml::Input::HNode_*,_false>._M_head_impl = (HNode *)local_28.Doc
      ;
      if (pHVar1 != (HNode *)0x0) {
        (*pHVar1->_vptr_HNode[2])();
        local_28.Doc = (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                        *)(this->TopNode)._M_t.
                          super___uniq_ptr_impl<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::yaml::Input::HNode_*,_std::default_delete<llvm::yaml::Input::HNode>_>
                          .super__Head_base<0UL,_llvm::yaml::Input::HNode_*,_false>._M_head_impl;
      }
      this->CurrentNode = (HNode *)local_28.Doc;
      return true;
    }
    peVar3 = (error_category *)std::_V2::generic_category();
    (this->EC)._M_value = 0x16;
    (this->EC)._M_cat = peVar3;
  }
  return false;
}

Assistant:

bool Input::setCurrentDocument() {
  if (DocIterator != Strm->end()) {
    Node *N = DocIterator->getRoot();
    if (!N) {
      EC = make_error_code(errc::invalid_argument);
      return false;
    }

    if (isa<NullNode>(N)) {
      // Empty files are allowed and ignored
      ++DocIterator;
      return setCurrentDocument();
    }
    TopNode = createHNodes(N);
    CurrentNode = TopNode.get();
    return true;
  }
  return false;
}